

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O1

int os_get_sysinfo(int code,void *param,long *result)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  iVar1 = oss_get_sysinfo(code,param,result);
  iVar2 = 1;
  if (iVar1 == 0) {
    uVar3 = 0;
    iVar2 = 0;
    if ((uint)code < 0x23) {
      uVar4 = (ulong)(uint)code;
      if ((0x7ff7fff0UL >> (uVar4 & 0x3f) & 1) == 0) {
        if (uVar4 == 0x21) {
          uVar3 = (ulong)(os_f_plain == 0);
        }
        else {
          if (uVar4 != 0x22) {
            return 0;
          }
          uVar3 = 1;
        }
      }
      *result = uVar3;
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int os_get_sysinfo(int code, void *param, long *result)
{
#ifdef RUNTIME
    /* if the oss layer recognizes the code, defer to its judgment */
    if (oss_get_sysinfo(code, param, result))
        return TRUE;
#endif

    /* check the type of information they're requesting */
    switch(code)
    {
    case SYSINFO_HTML:
    case SYSINFO_JPEG:
    case SYSINFO_PNG:
    case SYSINFO_WAV:
    case SYSINFO_MIDI:
    case SYSINFO_WAV_MIDI_OVL:
    case SYSINFO_WAV_OVL:
    case SYSINFO_MPEG:
    case SYSINFO_MPEG1:
    case SYSINFO_MPEG2:
    case SYSINFO_MPEG3:
    case SYSINFO_PREF_IMAGES:
    case SYSINFO_PREF_SOUNDS:
    case SYSINFO_PREF_MUSIC:
    case SYSINFO_PREF_LINKS:
    case SYSINFO_LINKS_HTTP:
    case SYSINFO_LINKS_FTP:
    case SYSINFO_LINKS_NEWS:
    case SYSINFO_LINKS_MAILTO:
    case SYSINFO_LINKS_TELNET:
    case SYSINFO_PNG_TRANS:
    case SYSINFO_PNG_ALPHA:
    case SYSINFO_OGG:
    case SYSINFO_MNG:
    case SYSINFO_MNG_TRANS:
    case SYSINFO_MNG_ALPHA:
        /* 
         *   we don't support any of these features - set the result to 0
         *   to indicate this 
         */
        *result = 0;

        /* return true to indicate that we recognized the code */
        return TRUE;

    case SYSINFO_INTERP_CLASS:
        /* we're a text-only character-mode interpreter */
        *result = SYSINFO_ICLASS_TEXT;
        return TRUE;

#ifdef RUNTIME

    case SYSINFO_BANNERS:
        /* 
         *   we support the os_banner_xxx() interfaces, as long as we're not
         *   in "plain" mode 
         */
        *result = !os_f_plain;
        return TRUE;

#endif /* RUNTIME */

    default:
        /* not recognized */
        return FALSE;
    }
}